

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

bool __thiscall FIX::SessionState::needTestRequest(SessionState *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  DateTime *rhs;
  IntField *this_00;
  undefined1 local_28 [8];
  UtcTimeStamp now;
  SessionState *this_local;
  
  now.super_DateTime.m_time = (int64_t)this;
  UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_28);
  rhs = &lastReceivedTime(this)->super_DateTime;
  iVar1 = FIX::operator-((DateTime *)local_28,rhs);
  iVar2 = testRequest(this);
  this_00 = &heartBtInt(this)->super_IntField;
  iVar3 = IntField::operator_cast_to_int(this_00);
  UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_28);
  return ((double)iVar2 + 1.0) * 1.2 * (double)iVar3 <= (double)iVar1;
}

Assistant:

bool needTestRequest() const
  {
    UtcTimeStamp now;
    return ( now - lastReceivedTime() ) >=
           ( ( 1.2 * ( ( double ) testRequest() + 1 ) ) * ( double ) heartBtInt() );
  }